

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3ShadowName(char *zName)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  while ((zName == (char *)0x0 ||
         (iVar1 = sqlite3StrICmp(zName,(char *)((long)&fts3ShadowName_azName_rel +
                                               (long)*(int *)((long)&fts3ShadowName_azName_rel +
                                                             lVar2))), iVar1 != 0))) {
    lVar2 = lVar2 + 4;
    if (lVar2 == 0x14) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int fts3ShadowName(const char *zName){
  static const char *azName[] = {
    "content", "docsize", "segdir", "segments", "stat", 
  };
  unsigned int i;
  for(i=0; i<sizeof(azName)/sizeof(azName[0]); i++){
    if( sqlite3_stricmp(zName, azName[i])==0 ) return 1;
  }
  return 0;
}